

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

LY_ERR lyd_value_validate_incomplete
                 (ly_ctx *ctx,lysc_type *type,lyd_value *val,lyd_node *ctx_node,lyd_node *tree)

{
  lyplg_type_validate_clb p_Var1;
  LY_ERR LVar2;
  void *pvVar3;
  ly_err_item *err;
  
  err = (ly_err_item *)0x0;
  p_Var1 = type->plugin->validate;
  if (p_Var1 != (lyplg_type_validate_clb)0x0) {
    LVar2 = (*p_Var1)(ctx,type,ctx_node,tree,val,&err);
    if (LVar2 != LY_SUCCESS) {
      if (err == (ly_err_item *)0x0) {
        pvVar3 = (*type->plugin->print)
                           (ctx,val,LY_VALUE_CANON,(void *)0x0,(ly_bool *)0x0,(size_t *)0x0);
        ly_vlog(ctx,(char *)0x0,LYVE_OTHER,"Resolving value \"%s\" failed.",pvVar3);
      }
      else {
        ly_err_print_build_path(ctx,ctx_node,(lysc_node *)0x0,err);
        ly_err_free(err);
      }
    }
    return LVar2;
  }
  __assert_fail("type->plugin->validate",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                ,0x233,
                "LY_ERR lyd_value_validate_incomplete(const struct ly_ctx *, const struct lysc_type *, struct lyd_value *, const struct lyd_node *, const struct lyd_node *)"
               );
}

Assistant:

LY_ERR
lyd_value_validate_incomplete(const struct ly_ctx *ctx, const struct lysc_type *type, struct lyd_value *val,
        const struct lyd_node *ctx_node, const struct lyd_node *tree)
{
    LY_ERR ret;
    struct ly_err_item *err = NULL;

    assert(type->plugin->validate);

    ret = type->plugin->validate(ctx, type, ctx_node, tree, val, &err);
    if (ret) {
        if (err) {
            ly_err_print_build_path(ctx, ctx_node, NULL, err);
            ly_err_free(err);
        } else {
            LOGVAL(ctx, LYVE_OTHER, "Resolving value \"%s\" failed.",
                    (char *)type->plugin->print(ctx, val, LY_VALUE_CANON, NULL, NULL, NULL));
        }
        return ret;
    }

    return LY_SUCCESS;
}